

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O2

int __thiscall QListModel::remove(QListModel *this,char *__filename)

{
  QListWidgetItem *pQVar1;
  qsizetype qVar2;
  int iVar3;
  long in_FS_OFFSET;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  QListWidgetItem *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = (QListWidgetItem *)__filename;
  if (__filename != (char *)0x0) {
    qVar2 = QtPrivate::indexOf<QListWidgetItem*,QListWidgetItem*>(&this->items,&local_28,0);
    local_40 = 0xffffffffffffffff;
    local_38 = 0;
    uStack_30 = 0;
    iVar3 = (int)qVar2;
    QAbstractItemModel::beginRemoveRows((QModelIndex *)this,(int)&local_40,iVar3);
    pQVar1 = (this->items).d.ptr[iVar3];
    pQVar1->d->theid = -1;
    pQVar1->view = (QListWidget *)0x0;
    QList<QListWidgetItem_*>::removeAt(&this->items,(long)iVar3);
    QAbstractItemModel::endRemoveRows();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QListModel::remove(QListWidgetItem *item)
{
    if (!item)
        return;
    int row = items.indexOf(item); // ### use index(item) - it's faster
    Q_ASSERT(row != -1);
    beginRemoveRows(QModelIndex(), row, row);
    items.at(row)->d->theid = -1;
    items.at(row)->view = nullptr;
    items.removeAt(row);
    endRemoveRows();
}